

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O1

int __thiscall CVmObjBigNum::sgn_val(CVmObjBigNum *this,vm_val_t *retval,vm_obj_id_t self)

{
  byte bVar1;
  
  bVar1 = (this->super_CVmObject).ext_[4];
  if ((bVar1 & 8) == 0) {
    retval->typ = VM_INT;
    if ((bVar1 & 1) == 0) {
      (retval->val).obj = 1;
    }
    else {
      (retval->val).obj = 0xffffffff;
    }
  }
  else {
    retval->typ = VM_INT;
    (retval->val).obj = 0;
  }
  return 1;
}

Assistant:

int CVmObjBigNum::sgn_val(VMG_ vm_val_t *retval, vm_obj_id_t self)
{
    /* figure the sgn value */
    if (is_zero(ext_))
        retval->set_int(0);
    else if (get_neg(ext_))
        retval->set_int(-1);
    else
        retval->set_int(1);

    /* success */
    return TRUE;
}